

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_notifications.cpp
# Opt level: O2

void __thiscall
node::KernelNotifications::warningSet(KernelNotifications *this,Warning id,bilingual_str *message)

{
  Warnings *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  string_view str;
  string safeStatus;
  string singleQuote;
  string strCmd;
  _Alloc_hider in_stack_fffffffffffffef8;
  bilingual_str in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->m_warnings;
  bilingual_str::bilingual_str((bilingual_str *)&stack0xfffffffffffffef8,message);
  bVar1 = Warnings::Set(this_00,(warning_type)in_stack_fffffffffffffef8._M_p,
                        in_stack_ffffffffffffff00);
  bilingual_str::~bilingual_str((bilingual_str *)&stack0xfffffffffffffef8);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"-alertnotify",(allocator<char> *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"",(allocator<char> *)&stack0xffffffffffffff38);
    ArgsManager::GetArg(&local_48,&gArgs,&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_48._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"\'",(allocator<char> *)&local_88);
      str._M_str = (message->original)._M_dataplus._M_p;
      str._M_len = (message->original)._M_string_length;
      SanitizeString_abi_cxx11_(&local_88,str,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff38,&local_68,&local_88);
      std::operator+(&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff38,&local_68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_88,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"%s",(allocator<char> *)&stack0xffffffffffffff38);
      util::ReplaceAll(&local_48,&local_a8,&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::thread::thread<void(&)(std::__cxx11::string_const&),std::__cxx11::string&,void>
                ((thread *)&local_a8,runCommand,&local_48);
      std::thread::detach();
      std::thread::~thread((thread *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void KernelNotifications::warningSet(kernel::Warning id, const bilingual_str& message)
{
    if (m_warnings.Set(id, message)) {
        AlertNotify(message.original);
    }
}